

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_2str.c
# Opt level: O3

char * strof_profle(MppCodingType coding,RK_U32 profile)

{
  char *pcVar1;
  
  if (coding - MPP_VIDEO_CodingMJPEG < 2) {
    return "base";
  }
  if (coding == MPP_VIDEO_CodingHEVC) {
    pcVar1 = "unknown";
    if (profile < 2) {
      pcVar1 = "main";
    }
    return pcVar1;
  }
  if (coding != MPP_VIDEO_CodingAVC) {
    return (char *)0x0;
  }
  if ((int)profile < 100) {
    if (profile == 0x42) {
      return "baseline";
    }
    if (profile == 0x4d) {
      return "main";
    }
  }
  else {
    if (profile == 100) {
      return "high";
    }
    if (profile == 0x6e) {
      return "high10";
    }
  }
  return "unknown";
}

Assistant:

const char *strof_profle(MppCodingType coding, RK_U32 profile)
{
    static const char *h264_profile_str[] = {
        "baseline",
        "main",
        "high",
        "high10",
    };
    static const char *h265_profile_str[] = {
        "main",
        "main10",
    };
    static const char *jpeg_profile_str[] = {
        "base",
    };
    static const char *vp8_profile_str[] = {
        "base",
    };
    static const char *unknown_str[] = {
        "unknown",
    };

    switch (coding) {
    case MPP_VIDEO_CodingAVC : {
        if (profile == H264_PROFILE_BASELINE)
            return h264_profile_str[0];
        else if (profile == H264_PROFILE_MAIN)
            return h264_profile_str[1];
        else if (profile == H264_PROFILE_HIGH)
            return h264_profile_str[2];
        else if (profile == H264_PROFILE_HIGH10)
            return h264_profile_str[3];
        else
            return unknown_str[0];
    } break;
    case MPP_VIDEO_CodingHEVC : {
        if (profile < 2)
            return h265_profile_str[0];
        else
            return unknown_str[0];
    } break;
    case MPP_VIDEO_CodingMJPEG : {
        return jpeg_profile_str[0];
    } break;
    case MPP_VIDEO_CodingVP8 : {
        return vp8_profile_str[0];
    } break;
    default : {
    } break;
    }

    return NULL;
}